

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox.cpp
# Opt level: O0

ostream * CS248::operator<<(ostream *os,BBox *b)

{
  ostream *poVar1;
  ostream *in_RSI;
  ostream *in_RDI;
  Vector3D *in_stack_ffffffffffffffe8;
  
  std::operator<<(in_RDI,"BBOX(");
  poVar1 = operator<<(in_RSI,in_stack_ffffffffffffffe8);
  std::operator<<(poVar1,", ");
  poVar1 = operator<<(in_RSI,in_stack_ffffffffffffffe8);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const BBox &b) {
  return os << "BBOX(" << b.min << ", " << b.max << ")";
}